

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  int iVar1;
  exr_storage_t eVar2;
  char *pcVar3;
  ostream *poVar4;
  ArgExc *pAVar5;
  stringstream _iex_throw_s;
  exr_chunk_info_t cinfo;
  stringstream local_1e0 [16];
  ostream local_1d0 [376];
  undefined1 local_58 [32];
  ulong local_38;
  
  iVar1 = exr_read_scanline_chunk_info
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     ((this->_data).
                      super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->partNumber,scanLine,local_58);
  if (iVar1 != 0) {
    eVar2 = Context::storage(&this->_ctxt,
                             ((this->_data).
                              super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->partNumber);
    iex_debugTrap();
    if (eVar2 == EXR_STORAGE_TILED) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1d0,"Error reading pixel data from image file \"",0x2a);
      pcVar3 = Context::fileName(&this->_ctxt);
      poVar4 = std::operator<<(local_1d0,pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\". Tried to read a raw scanline from a tiled image.",0x33);
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar5,local_1e0);
      __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    std::__cxx11::stringstream::stringstream(local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1d0,"Error reading pixel data from image file \"",0x2a);
    pcVar3 = Context::fileName(&this->_ctxt);
    poVar4 = std::operator<<(local_1d0,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\". Unable to query data block information.",0x2a);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_1e0);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_38 <= (ulong)(long)*pixelDataSize) {
    *pixelDataSize = (int)local_38;
    iVar1 = exr_read_chunk(*(this->_ctxt)._ctxt.
                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,((this->_data).
                                    super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->partNumber,local_58,pixelData);
    if (iVar1 == 0) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1d0,"Error reading pixel data from image file \"",0x2a);
    pcVar3 = Context::fileName(&this->_ctxt);
    poVar4 = std::operator<<(local_1d0,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\". Unable to read raw pixel data of ",0x24);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*pixelDataSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes.",7);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_1e0);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1d0,"Error reading pixel data from image file \"",0x2a);
  pcVar3 = Context::fileName(&this->_ctxt);
  poVar4 = std::operator<<(local_1d0,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\". Provided buffer is too small to read raw pixel data:",0x37);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*pixelDataSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes.",7);
  pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar5,local_1e0);
  __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
ScanLineInputFile::rawPixelDataToBuffer (
    int scanLine, char* pixelData, int& pixelDataSize) const
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
                               _ctxt, _data->partNumber, scanLine, &cinfo))
    {
        if (cinfo.packed_size > static_cast<uint64_t> (pixelDataSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Provided buffer is too small to read raw pixel data:"
                    << pixelDataSize << " bytes.");
        }

        pixelDataSize = static_cast<int> (cinfo.packed_size);

        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo, pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw pixel data of "
                    << pixelDataSize << " bytes.");
        }
    }
    else
    {
        if (_ctxt.storage (_data->partNumber) == EXR_STORAGE_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Tried to read a raw scanline from a tiled image.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Unable to query data block information.");
        }
    }
}